

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void removePaddingBits(uchar *out,uchar *in,size_t olinebits,size_t ilinebits,uint h)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  size_t obp;
  size_t local_38;
  
  local_38 = 0;
  uVar2 = 0;
  for (uVar1 = 0; uVar3 = uVar2, sVar4 = olinebits, uVar1 != h; uVar1 = uVar1 + 1) {
    while (sVar4 != 0) {
      setBitOfReversedStream(&local_38,out,(in[uVar3 >> 3] >> (~(byte)uVar3 & 7) & 1) != 0);
      uVar3 = uVar3 + 1;
      sVar4 = sVar4 - 1;
    }
    uVar2 = uVar2 + ilinebits;
  }
  return;
}

Assistant:

static void removePaddingBits(unsigned char* out, const unsigned char* in,
                              size_t olinebits, size_t ilinebits, unsigned h)
{
  /*
  After filtering there are still padding bits if scanlines have non multiple of 8 bit amounts. They need
  to be removed (except at last scanline of (Adam7-reduced) image) before working with pure image buffers
  for the Adam7 code, the color convert code and the output to the user.
  in and out are allowed to be the same buffer, in may also be higher but still overlapping; in must
  have >= ilinebits*h bits, out must have >= olinebits*h bits, olinebits must be <= ilinebits
  also used to move bits after earlier such operations happened, e.g. in a sequence of reduced images from Adam7
  only useful if (ilinebits - olinebits) is a value in the range 1..7
  */
  unsigned y;
  size_t diff = ilinebits - olinebits;
  size_t ibp = 0, obp = 0; /*input and output bit pointers*/
  for(y = 0; y < h; y++)
  {
    size_t x;
    for(x = 0; x < olinebits; x++)
    {
      unsigned char bit = readBitFromReversedStream(&ibp, in);
      setBitOfReversedStream(&obp, out, bit);
    }
    ibp += diff;
  }
}